

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
squareToAlgebraic_abi_cxx11_(byte square)

{
  byte in_SIL;
  undefined7 in_register_00000039;
  string local_58 [8];
  string second;
  string local_38 [8];
  string first;
  byte square_local;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  switch(in_SIL & 7) {
  case 0:
    std::__cxx11::string::operator=(local_38,"a");
    break;
  case 1:
    std::__cxx11::string::operator=(local_38,"b");
    break;
  case 2:
    std::__cxx11::string::operator=(local_38,"c");
    break;
  case 3:
    std::__cxx11::string::operator=(local_38,"d");
    break;
  case 4:
    std::__cxx11::string::operator=(local_38,"e");
    break;
  case 5:
    std::__cxx11::string::operator=(local_38,"f");
    break;
  case 6:
    std::__cxx11::string::operator=(local_38,"g");
    break;
  case 7:
    std::__cxx11::string::operator=(local_38,"h");
  }
  switch(in_SIL >> 3) {
  case 0:
    std::__cxx11::string::operator=(local_58,"8");
    break;
  case 1:
    std::__cxx11::string::operator=(local_58,"7");
    break;
  case 2:
    std::__cxx11::string::operator=(local_58,"6");
    break;
  case 3:
    std::__cxx11::string::operator=(local_58,"5");
    break;
  case 4:
    std::__cxx11::string::operator=(local_58,"4");
    break;
  case 5:
    std::__cxx11::string::operator=(local_58,"3");
    break;
  case 6:
    std::__cxx11::string::operator=(local_58,"2");
    break;
  case 7:
    std::__cxx11::string::operator=(local_58,"1");
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(in_register_00000039,square),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT71(in_register_00000039,square);
}

Assistant:

std::string squareToAlgebraic(const byte square) {
  std::string first;
  std::string second;
  switch(square % 8) {
    case 0:
      first = "a";
      break;
    case 1:
      first = "b";
      break;
    case 2:
      first = "c";
      break;
    case 3:
      first = "d";
      break;
    case 4:
      first = "e";
      break;
    case 5:
      first = "f";
      break;
    case 6:
      first = "g";
      break;
    case 7:
      first = "h";
      break;
  }

  switch(square / 8) {
    case 0:
      second = "8";
      break;
    case 1:
      second = "7";
      break;
    case 2:
      second = "6";
      break;
    case 3:
      second = "5";
      break;
    case 4:
      second = "4";
      break;
    case 5:
      second = "3";
      break;
    case 6:
      second = "2";
      break;
    case 7:
      second = "1";
      break;
  }

  return first + second;
}